

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldTypesTests::TestDateTime_convertToNanos::RunImpl(TestDateTime_convertToNanos *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_318;
  int local_2f8 [10];
  TestDetails local_2d0;
  int local_2b0 [10];
  TestDetails local_288;
  int local_268 [10];
  TestDetails local_240;
  int local_220 [10];
  TestDetails local_1f8;
  int local_1d8 [10];
  TestDetails local_1b0;
  int local_190 [10];
  TestDetails local_168;
  int local_148 [10];
  TestDetails local_120;
  int local_100 [10];
  TestDetails local_d8;
  int local_b8 [10];
  TestDetails local_90;
  int local_70 [10];
  TestDetails local_48;
  int local_24 [5];
  TestDateTime_convertToNanos *local_10;
  TestDateTime_convertToNanos *this_local;
  
  local_10 = this;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_24[1] = 1000000000;
  local_24[0] = FIX::DateTime::convertToNanos(1,0);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_48,*ppTVar3,0x38);
  UnitTest::CheckEqual<int,int>(pTVar1,local_24 + 1,local_24,&local_48);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_70[1] = 100000000;
  local_70[0] = FIX::DateTime::convertToNanos(1,1);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_90,*ppTVar3,0x39);
  UnitTest::CheckEqual<int,int>(pTVar1,local_70 + 1,local_70,&local_90);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_b8[1] = 10000000;
  local_b8[0] = FIX::DateTime::convertToNanos(1,2);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_d8,*ppTVar3,0x3a);
  UnitTest::CheckEqual<int,int>(pTVar1,local_b8 + 1,local_b8,&local_d8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_100[1] = 1000000;
  local_100[0] = FIX::DateTime::convertToNanos(1,3);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_120,*ppTVar3,0x3b);
  UnitTest::CheckEqual<int,int>(pTVar1,local_100 + 1,local_100,&local_120);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_148[1] = 100000;
  local_148[0] = FIX::DateTime::convertToNanos(1,4);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_168,*ppTVar3,0x3c);
  UnitTest::CheckEqual<int,int>(pTVar1,local_148 + 1,local_148,&local_168);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_190[1] = 10000;
  local_190[0] = FIX::DateTime::convertToNanos(1,5);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_1b0,*ppTVar3,0x3d);
  UnitTest::CheckEqual<int,int>(pTVar1,local_190 + 1,local_190,&local_1b0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_1d8[1] = 1000;
  local_1d8[0] = FIX::DateTime::convertToNanos(1,6);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_1f8,*ppTVar3,0x3e);
  UnitTest::CheckEqual<int,int>(pTVar1,local_1d8 + 1,local_1d8,&local_1f8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_220[1] = 100;
  local_220[0] = FIX::DateTime::convertToNanos(1,7);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_240,*ppTVar3,0x3f);
  UnitTest::CheckEqual<int,int>(pTVar1,local_220 + 1,local_220,&local_240);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_268[1] = 10;
  local_268[0] = FIX::DateTime::convertToNanos(1,8);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_288,*ppTVar3,0x40);
  UnitTest::CheckEqual<int,int>(pTVar1,local_268 + 1,local_268,&local_288);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2b0[1] = 1;
  local_2b0[0] = FIX::DateTime::convertToNanos(1,9);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_2d0,*ppTVar3,0x41);
  UnitTest::CheckEqual<int,int>(pTVar1,local_2b0 + 1,local_2b0,&local_2d0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2f8[1] = 1;
  local_2f8[0] = FIX::DateTime::convertToNanos(1,0x19);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_318,*ppTVar3,0x42);
  UnitTest::CheckEqual<int,int>(pTVar1,local_2f8 + 1,local_2f8,&local_318);
  return;
}

Assistant:

TEST(DateTime_convertToNanos)
{

  CHECK_EQUAL(1000000000,FIX::DateTime::convertToNanos(1,0));
  CHECK_EQUAL(100000000,FIX::DateTime::convertToNanos(1,1));
  CHECK_EQUAL(10000000,FIX::DateTime::convertToNanos(1,2));
  CHECK_EQUAL(1000000,FIX::DateTime::convertToNanos(1,3));
  CHECK_EQUAL(100000,FIX::DateTime::convertToNanos(1,4));
  CHECK_EQUAL(10000,FIX::DateTime::convertToNanos(1,5));
  CHECK_EQUAL(1000,FIX::DateTime::convertToNanos(1,6));
  CHECK_EQUAL(100,FIX::DateTime::convertToNanos(1,7));
  CHECK_EQUAL(10,FIX::DateTime::convertToNanos(1,8));
  CHECK_EQUAL(1,FIX::DateTime::convertToNanos(1,9));
  CHECK_EQUAL(1,FIX::DateTime::convertToNanos(1,25));

}